

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

void __thiscall cmFileCopier::DefaultFilePermissions(cmFileCopier *this)

{
  cmFileCopier *this_local;
  
  this->FilePermissions = 0;
  this->FilePermissions = this->FilePermissions | 0x100;
  this->FilePermissions = this->FilePermissions | 0x80;
  this->FilePermissions = this->FilePermissions | 0x20;
  this->FilePermissions = this->FilePermissions | 4;
  return;
}

Assistant:

void cmFileCopier::DefaultFilePermissions()
{
  // Use read/write permissions.
  this->FilePermissions = 0;
  this->FilePermissions |= mode_owner_read;
  this->FilePermissions |= mode_owner_write;
  this->FilePermissions |= mode_group_read;
  this->FilePermissions |= mode_world_read;
}